

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O1

int evfilt_proc_knote_create(filter *filt,knote *kn)

{
  unsigned_short *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int __fd;
  uint32_t local_34;
  epoll_udata *local_30;
  
  if ((int)(kn->kev).fflags < 0) {
    lVar4 = syscall(0x1b2,(ulong)(uint)(kn->kev).ident,0);
    iVar3 = -1;
    __fd = (int)lVar4;
    if (-1 < __fd) {
      iVar2 = fcntl(__fd,2,1);
      if (-1 < iVar2) {
        (kn->field_10).kn_timerfd = __fd;
        puVar1 = &(kn->kev).flags;
        *(byte *)puVar1 = (byte)*puVar1 | 0x30;
        local_30 = &kn->kn_udata;
        (kn->kn_udata).field_0.ud_kn = kn;
        (kn->kn_udata).ud_type = EPOLL_UDATA_KNOTE;
        local_34 = 1;
        iVar3 = epoll_ctl(filt->kf_kqueue->epollfd,1,__fd,(epoll_event *)&local_34);
        iVar3 = iVar3 >> 0x1f;
      }
    }
  }
  else {
    (kn->field_10).kn_timerfd = -1;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
evfilt_proc_knote_create(struct filter *filt, struct knote *kn)
{
    int pfd;

    /* This mirrors the behaviour of kqueue if fflags doesn't specify any events */
    if (!(kn->kev.fflags & NOTE_EXIT)) {
        dbg_printf("not monitoring pid=%u as no NOTE_* fflags set", (unsigned int)kn->kev.ident);
        kn->kn_procfd = -1;
        return 0;
    }

    /* Returns an FD, which, when readable, indicates the process has exited */
    pfd = syscall(SYS_pidfd_open, (pid_t)kn->kev.ident, 0);
    if (pfd < 0) {
        dbg_perror("pidfd_open(2)");
        return (-1);
    }
    if (fcntl(pfd, F_SETFD, FD_CLOEXEC) < 0) {
        dbg_perror("fcntl(2)");
        return (-1);
    }
    dbg_printf("created pidfd=%i monitoring pid=%u", pfd, (unsigned int)kn->kev.ident);

    kn->kn_procfd = pfd;

    /*
     * These get added by default on macOS (and likely FreeBSD)
     * which make sense considering a process exiting is an
     * edge triggered event, not a level triggered one.
     */
    kn->kev.flags |= EV_ONESHOT;
    kn->kev.flags |= EV_CLEAR;

    KN_UDATA(kn);   /* populate this knote's kn_udata field */

    return evfilt_proc_knote_enable(filt, kn);
}